

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

UINT16 TPMU_SYM_MODE_Marshal(TPMU_SYM_MODE *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  if ((selector != 6) && (selector != 3)) {
    return 0;
  }
  UINT16_Marshal(&source->tdes,buffer,size);
  return 2;
}

Assistant:

UINT16
TPMU_SYM_MODE_Marshal(TPMU_SYM_MODE *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_TDES
        case TPM_ALG_TDES:
            return TPMI_ALG_SYM_MODE_Marshal((TPMI_ALG_SYM_MODE *)&(source->tdes), buffer, size);
#endif // ALG_TDES
#if         ALG_AES
        case TPM_ALG_AES:
            return TPMI_ALG_SYM_MODE_Marshal((TPMI_ALG_SYM_MODE *)&(source->aes), buffer, size);
#endif // ALG_AES
#if         ALG_SM4
        case TPM_ALG_SM4:
            return TPMI_ALG_SYM_MODE_Marshal((TPMI_ALG_SYM_MODE *)&(source->sm4), buffer, size);
#endif // ALG_SM4
#if         ALG_CAMELLIA
        case TPM_ALG_CAMELLIA:
            return TPMI_ALG_SYM_MODE_Marshal((TPMI_ALG_SYM_MODE *)&(source->camellia), buffer, size);
#endif // ALG_CAMELLIA
#if         ALG_XOR
        case TPM_ALG_XOR:
            return 0;
#endif // ALG_XOR
        case TPM_ALG_NULL:
            return 0;
    }
    return 0;
}